

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O0

Base * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Base>
          (Structure *this,shared_ptr<Assimp::Blender::Base> *out,size_t *s)

{
  Base *this_00;
  element_type *peVar1;
  shared_ptr<Assimp::Blender::Base> local_30;
  size_t *local_20;
  size_t *s_local;
  shared_ptr<Assimp::Blender::Base> *out_local;
  Structure *this_local;
  
  local_20 = s;
  s_local = (size_t *)out;
  out_local = (shared_ptr<Assimp::Blender::Base> *)this;
  this_00 = (Base *)operator_new(0x38);
  Base::Base(this_00);
  ::std::shared_ptr<Assimp::Blender::Base>::shared_ptr<Assimp::Blender::Base,void>
            (&local_30,this_00);
  ::std::shared_ptr<Assimp::Blender::Base>::operator=
            ((shared_ptr<Assimp::Blender::Base> *)s_local,&local_30);
  ::std::shared_ptr<Assimp::Blender::Base>::~shared_ptr(&local_30);
  *local_20 = 1;
  peVar1 = ::std::__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2> *)s_local);
  return peVar1;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }